

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::PipelineStateVkImpl::DvpValidateResourceLimits(PipelineStateVkImpl *this)

{
  PipelineStateDesc *pPVar1;
  VkBool32 *pVVar2;
  VkBool32 *pVVar3;
  uint32_t *Args_6;
  uint32_t *Args_6_00;
  uint32_t *Args_6_01;
  uint32_t *Args_6_02;
  int *piVar4;
  VkBool32 VVar5;
  VulkanPhysicalDevice *pVVar6;
  VulkanPhysicalDevice *pVVar7;
  VulkanPhysicalDevice *pVVar8;
  PipelineResourceSignatureVkImpl *this_00;
  VkBool32 *pVVar9;
  byte bVar10;
  Int32 IVar11;
  SHADER_TYPE SVar12;
  RenderDeviceVkImpl *pRVar13;
  PipelineResourceDesc *Args_4;
  PipelineResourceAttribsType *pPVar14;
  ulong uVar15;
  uint32_t *Args_6_03;
  uint uVar16;
  ulong uVar17;
  Uint32 ResIndex;
  Uint32 ShaderInd;
  long lVar18;
  SHADER_TYPE ShaderType;
  uint32_t *Args_6_04;
  array<unsigned_int,_16UL> *paVar19;
  bool bVar20;
  char (*in_stack_fffffffffffffd38) [124];
  string msg;
  Uint32 NumSampledImages;
  undefined4 uStack_294;
  Uint32 NumInputAttachments;
  Uint32 NumDynamicUniformBuffers;
  Uint32 NumUniformBuffers;
  Uint32 NumDynamicStorageBuffers;
  Uint32 NumStorageBuffers;
  Uint32 NumStorageImages;
  VulkanPhysicalDevice *local_278;
  Uint32 NumAccelerationStructures;
  Uint32 NumSamplers;
  PipelineResourceSignatureDesc *local_268;
  array<bool,_6UL> ShaderStagePresented;
  array<unsigned_int,_16UL> DescriptorCount;
  array<std::array<unsigned_int,_16UL>,_6UL> PerStageDescriptorCount;
  
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         *)this);
  pVVar6 = (pRVar13->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         *)this);
  pVVar7 = (pRVar13->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         *)this);
  local_278 = (pRVar13->m_PhysicalDevice)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         *)this);
  pVVar8 = (pRVar13->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  DescriptorCount._M_elems[0xc] = 0;
  DescriptorCount._M_elems[0xd] = 0;
  DescriptorCount._M_elems[0xe] = 0;
  DescriptorCount._M_elems[0xf] = 0;
  DescriptorCount._M_elems[8] = 0;
  DescriptorCount._M_elems[9] = 0;
  DescriptorCount._M_elems[10] = 0;
  DescriptorCount._M_elems[0xb] = 0;
  DescriptorCount._M_elems[4] = 0;
  DescriptorCount._M_elems[5] = 0;
  DescriptorCount._M_elems[6] = 0;
  DescriptorCount._M_elems[7] = 0;
  DescriptorCount._M_elems[0] = 0;
  DescriptorCount._M_elems[1] = 0;
  DescriptorCount._M_elems[2] = 0;
  DescriptorCount._M_elems[3] = 0;
  memset(&PerStageDescriptorCount,0,0x180);
  ShaderStagePresented._M_elems[4] = false;
  ShaderStagePresented._M_elems[5] = false;
  ShaderStagePresented._M_elems[0] = false;
  ShaderStagePresented._M_elems[1] = false;
  ShaderStagePresented._M_elems[2] = false;
  ShaderStagePresented._M_elems[3] = false;
  bVar10 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
  uVar16 = 0;
  NumStorageImages = 0;
  NumStorageBuffers = 0;
  NumDynamicStorageBuffers = 0;
  NumSamplers = 0;
  NumUniformBuffers = 0;
  NumDynamicUniformBuffers = 0;
  NumInputAttachments = 0;
  NumAccelerationStructures = 0;
  if (bVar10 != 0) {
    pVVar2 = (VkBool32 *)((long)&(pVVar8->m_ExtProperties).DescriptorIndexing + 0x1c);
    pVVar3 = (VkBool32 *)((long)&(pVVar8->m_ExtProperties).DescriptorIndexing + 0x18);
    pPVar1 = &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_Desc;
    uVar17 = 0;
    do {
      this_00 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures[uVar17].
                m_pObject;
      if ((this_00 != (PipelineResourceSignatureVkImpl *)0x0) &&
         ((this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources != 0)) {
        local_268 = &(this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     .m_Desc;
        ResIndex = 0;
        do {
          Args_4 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                             (&this_00->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              ResIndex);
          pPVar14 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                              (&this_00->
                                super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                               ResIndex);
          uVar16 = (uint)((ulong)*(undefined8 *)pPVar14 >> 0x20);
          uVar15 = (ulong)((uVar16 >> 0x19 & 0x1f) << 2);
          piVar4 = (int *)((long)DescriptorCount._M_elems + uVar15);
          *piVar4 = *piVar4 + (uVar16 & 0x1ffffff);
          SVar12 = Args_4->ShaderStages;
          if (SVar12 != SHADER_TYPE_UNKNOWN) {
            do {
              ShaderType = -SVar12 & SVar12;
              IVar11 = GetShaderTypePipelineIndex
                                 (ShaderType,
                                  (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                                  .m_Desc.PipelineType);
              uVar16 = (uint)((ulong)*(undefined8 *)pPVar14 >> 0x20);
              piVar4 = (int *)((long)PerStageDescriptorCount._M_elems[IVar11]._M_elems + uVar15);
              *piVar4 = *piVar4 + (uVar16 & 0x1ffffff);
              ShaderStagePresented._M_elems[IVar11] = true;
              bVar20 = ShaderType != SVar12;
              SVar12 = ShaderType ^ SVar12;
            } while (bVar20);
          }
          if ((Args_4->Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != PIPELINE_RESOURCE_FLAG_NONE)
          {
            if (((byte)(uVar16 >> 0x19) & 0x1f) < 0x10) {
              pVVar9 = pVVar2;
              switch(uVar16 >> 0x19 & 0x1f) {
              case 0:
              case 0xf:
                goto switchD_001ebf0b_caseD_0;
              case 1:
              case 2:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderSampledImageArrayNonUniformIndexing;
                pVVar9 = pVVar3;
                break;
              case 3:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderStorageImageArrayNonUniformIndexing;
                pVVar9 = (VkBool32 *)((long)&(pVVar8->m_ExtProperties).DescriptorIndexing + 0x20);
                break;
              case 4:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderUniformTexelBufferArrayNonUniformIndexing;
                pVVar9 = pVVar3;
                break;
              case 5:
              case 6:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderStorageTexelBufferArrayNonUniformIndexing;
                break;
              case 7:
              case 8:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderUniformBufferArrayNonUniformIndexing;
                pVVar9 = (VkBool32 *)((long)&(pVVar8->m_ExtProperties).DescriptorIndexing + 0x14);
                break;
              default:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderStorageBufferArrayNonUniformIndexing;
                break;
              case 0xd:
                VVar5 = (local_278->m_ExtFeatures).DescriptorIndexing.
                        shaderInputAttachmentArrayNonUniformIndexing;
                pVVar9 = (VkBool32 *)((long)&(pVVar8->m_ExtProperties).DescriptorIndexing + 0x24);
                break;
              case 0xe:
                goto switchD_001ebf0b_caseD_e;
              }
              if (VVar5 == 0) goto LAB_001ec067;
              if (*pVVar9 != 0) goto switchD_001ebf0b_caseD_0;
              FormatString<char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
                        (&msg,(Diligent *)"Performance warning in PSO \'",(char (*) [29])pPVar1,
                         (char **)"\', resource signature \'",(char (*) [24])local_268,
                         (char **)"\': shader resource \'",(char (*) [21])Args_4,
                         (char **)
                         "\' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device."
                         ,(char (*) [91])in_stack_fffffffffffffd38);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
              }
            }
            else {
switchD_001ebf0b_caseD_e:
              FormatString<char[27]>(&msg,(char (*) [27])"Unexpected descriptor type");
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                         ,0x41e);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
LAB_001ec067:
              FormatString<char[6],char_const*,char[24],char_const*,char[29],char_const*,char[124]>
                        (&msg,(Diligent *)0x8146c7,(char (*) [6])pPVar1,
                         (char **)"\', resource signature \'",(char (*) [24])local_268,
                         (char **)"\' contains shader resource \'",(char (*) [29])Args_4,
                         (char **)
                         "\' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type."
                         ,in_stack_fffffffffffffd38);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
switchD_001ebf0b_caseD_0:
          ResIndex = ResIndex + 1;
        } while (ResIndex <
                 (this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc.NumResources);
        bVar10 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < bVar10);
    uVar16 = DescriptorCount._M_elems[2] + DescriptorCount._M_elems[1] + DescriptorCount._M_elems[4]
    ;
    NumStorageImages =
         DescriptorCount._M_elems[5] + DescriptorCount._M_elems[3] + DescriptorCount._M_elems[6];
    NumStorageBuffers = DescriptorCount._M_elems[10] + DescriptorCount._M_elems[9];
    NumDynamicStorageBuffers = DescriptorCount._M_elems[0xc] + DescriptorCount._M_elems[0xb];
    NumSamplers = DescriptorCount._M_elems[0];
    NumUniformBuffers = DescriptorCount._M_elems[7];
    NumDynamicUniformBuffers = DescriptorCount._M_elems[8];
    NumInputAttachments = DescriptorCount._M_elems[0xd];
    NumAccelerationStructures = DescriptorCount._M_elems[0xf];
  }
  _NumSampledImages = (Char *)CONCAT44(uStack_294,uVar16);
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x60) < NumSamplers) {
    FormatString<char[9],char_const*,char[28],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of samplers (",(char (*) [28])&NumSamplers,
               (uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x60),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x447);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    uVar16 = NumSampledImages;
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x74) < uVar16) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of sampled images (",
               (char (*) [34])&NumSampledImages,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x74),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x449);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x78) < NumStorageImages) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage images (",
               (char (*) [34])&NumStorageImages,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x78),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,1099);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x6c) < NumStorageBuffers) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage buffers (",
               (char (*) [35])&NumStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x6c),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x70) < NumDynamicStorageBuffers) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic storage buffers (",
               (char (*) [43])&NumDynamicStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x70),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 100) < NumUniformBuffers) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of uniform buffers (",
               (char (*) [35])&NumUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 100),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x451);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x68) < NumDynamicUniformBuffers) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic uniform buffers (",
               (char (*) [43])&NumDynamicUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x68),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x453);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x7c) < NumInputAttachments) {
    FormatString<char[9],char_const*,char[37],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of input attachments (",
               (char (*) [37])&NumInputAttachments,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar6->m_Properties).limits + 0x7c),(uint *)0x91fe20,
               (char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x455);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar7->m_ExtProperties).AccelStruct + 0x30) < NumAccelerationStructures
     ) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of acceleration structures (",
               (char (*) [43])&NumAccelerationStructures,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar7->m_ExtProperties).AccelStruct + 0x30),(uint *)0x91fe20
               ,(char (*) [3])in_stack_fffffffffffffd38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x457);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar1 = &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            .m_Desc;
  Args_6 = (uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x5c);
  Args_6_00 = (uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x44);
  Args_6_01 = (uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x50);
  Args_6_02 = (uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x54);
  local_278 = (VulkanPhysicalDevice *)((long)&(pVVar6->m_Properties).limits + 0x4c);
  local_268 = (PipelineResourceSignatureDesc *)((long)&(pVVar6->m_Properties).limits + 0x48);
  Args_6_03 = (uint32_t *)((long)&(pVVar6->m_Properties).limits + 0x58);
  Args_6_04 = (uint32_t *)((long)&(pVVar7->m_ExtProperties).AccelStruct + 0x28);
  lVar18 = 0;
  paVar19 = PerStageDescriptorCount._M_elems;
  do {
    if (ShaderStagePresented._M_elems[lVar18] == true) {
      SVar12 = GetShaderTypeFromPipelineIndex
                         ((Int32)lVar18,
                          (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                          .m_Desc.PipelineType);
      _NumSampledImages = GetShaderTypeLiteralName(SVar12);
      NumStorageImages =
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[2] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[1] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[4];
      NumStorageBuffers =
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[5] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[3] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[6];
      NumDynamicStorageBuffers =
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[0xc] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[10] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[0xb] +
           ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[9];
      NumSamplers = ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[8] +
                    ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[7];
      NumUniformBuffers = ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[0];
      NumDynamicUniformBuffers = ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[0xd];
      NumInputAttachments = ((array<unsigned_int,_16UL> *)paVar19->_M_elems)->_M_elems[0xf];
      NumAccelerationStructures =
           NumStorageBuffers + NumStorageImages + NumSamplers + NumUniformBuffers +
           NumDynamicUniformBuffers + NumInputAttachments + NumDynamicStorageBuffers;
      if (*Args_6 < NumAccelerationStructures) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the total number of resources (",
                   (char (*) [35])&NumAccelerationStructures,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])Args_6,(uint *)0x91fe20,
                   (char (*) [3])in_stack_fffffffffffffd38);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_00 < NumUniformBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[28],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of samplers (",
                   (char (*) [28])&NumUniformBuffers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_00,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_01 < NumStorageImages) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of sampled images (",
                   (char (*) [34])&NumStorageImages,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_01,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_02 < NumStorageBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of storage images (",
                   (char (*) [34])&NumStorageBuffers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_02,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x480);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(uint *)local_278 < NumDynamicStorageBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of storage buffers (",
                   (char (*) [35])&NumDynamicStorageBuffers,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])local_278,
                   (uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x482);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(uint *)local_268 < NumSamplers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of uniform buffers (",
                   (char (*) [35])&NumSamplers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])local_268,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x484);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_03 < NumDynamicUniformBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[37],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of input attachments ("
                   ,(char (*) [37])&NumDynamicUniformBuffers,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])Args_6_03,
                   (uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x486);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_04 < NumInputAttachments) {
        FormatString<char[9],char_const*,char[17],char_const*,char[43],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,
                   (char **)"\', the number of acceleration structures (",
                   (char (*) [43])&NumInputAttachments,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_04,(uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffd38
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar18 = lVar18 + 1;
    paVar19 = paVar19 + 1;
  } while (lVar18 != 6);
  return;
}

Assistant:

void PipelineStateVkImpl::DvpValidateResourceLimits() const
{
    const VkPhysicalDeviceLimits&                             Limits       = GetDevice()->GetPhysicalDevice().GetProperties().limits;
    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits     = GetDevice()->GetPhysicalDevice().GetExtProperties().AccelStruct;
    const VkPhysicalDeviceDescriptorIndexingFeaturesEXT&      DescIndFeats = GetDevice()->GetPhysicalDevice().GetExtFeatures().DescriptorIndexing;
    const VkPhysicalDeviceDescriptorIndexingPropertiesEXT&    DescIndProps = GetDevice()->GetPhysicalDevice().GetExtProperties().DescriptorIndexing;
    const Uint32                                              DescCount    = static_cast<Uint32>(DescriptorType::Count);

    std::array<Uint32, DescCount>                                      DescriptorCount         = {};
    std::array<std::array<Uint32, DescCount>, MAX_SHADERS_IN_PIPELINE> PerStageDescriptorCount = {};
    std::array<bool, MAX_SHADERS_IN_PIPELINE>                          ShaderStagePresented    = {};

    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const PipelineResourceSignatureVkImpl* pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const PipelineResourceDesc&                             ResDesc   = pSignature->GetResourceDesc(r);
            const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttr   = pSignature->GetResourceAttribs(r);
            const Uint32                                            DescIndex = static_cast<Uint32>(ResAttr.DescrType);

            DescriptorCount[DescIndex] += ResAttr.ArraySize;

            for (SHADER_TYPE ShaderStages = ResDesc.ShaderStages; ShaderStages != 0;)
            {
                const Int32 ShaderInd = GetShaderTypePipelineIndex(ExtractLSB(ShaderStages), m_Desc.PipelineType);
                PerStageDescriptorCount[ShaderInd][DescIndex] += ResAttr.ArraySize;
                ShaderStagePresented[ShaderInd] = true;
            }

            if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0)
            {
                bool NonUniformIndexingSupported = false;
                bool NonUniformIndexingIsNative  = false;
                switch (ResAttr.GetDescriptorType())
                {
                    case DescriptorType::Sampler:
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;
                    case DescriptorType::CombinedImageSampler:
                    case DescriptorType::SeparateImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderSampledImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformTexelBuffer:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageTexelBuffer:
                    case DescriptorType::StorageTexelBuffer_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformBuffer:
                    case DescriptorType::UniformBufferDynamic:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderUniformBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageBuffer:
                    case DescriptorType::StorageBuffer_ReadOnly:
                    case DescriptorType::StorageBufferDynamic:
                    case DescriptorType::StorageBufferDynamic_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::InputAttachment:
                        NonUniformIndexingSupported = DescIndFeats.shaderInputAttachmentArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderInputAttachmentArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::AccelerationStructure:
                        // There is no separate feature for acceleration structures, GLSL spec says:
                        // "If GL_EXT_nonuniform_qualifier is supported
                        // When aggregated into arrays within a shader, accelerationStructureEXT can
                        // be indexed with a non-uniform integral expressions, when decorated with the
                        // nonuniformEXT qualifier."
                        // Descriptor indexing is supported here, otherwise error will be generated in ValidatePipelineResourceSignatureDesc().
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;

                    default:
                        UNEXPECTED("Unexpected descriptor type");
                }

                // TODO: We don't know if this resource is used for non-uniform indexing or not.
                if (!NonUniformIndexingSupported)
                {
                    LOG_WARNING_MESSAGE("PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "' contains shader resource '",
                                        ResDesc.Name, "' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type.");
                }
                else if (!NonUniformIndexingIsNative)
                {
                    LOG_WARNING_MESSAGE("Performance warning in PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "': shader resource '",
                                        ResDesc.Name, "' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device.");
                }
            }
        }
    }

    // Check total descriptor count
    {
        const Uint32 NumSampledImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)];
        const Uint32 NumDynamicStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumSamplers               = DescriptorCount[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumUniformBuffers         = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBuffer)];
        const Uint32 NumDynamicUniformBuffers  = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumInputAttachments       = DescriptorCount[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = DescriptorCount[static_cast<Uint32>(DescriptorType::AccelerationStructure)];

        DEV_CHECK_ERR(NumSamplers <= Limits.maxDescriptorSetSamplers,
                      "In PSO '", m_Desc.Name, "', the number of samplers (", NumSamplers, ") exceeds the limit (", Limits.maxDescriptorSetSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxDescriptorSetSampledImages,
                      "In PSO '", m_Desc.Name, "', the number of sampled images (", NumSampledImages, ") exceeds the limit (", Limits.maxDescriptorSetSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxDescriptorSetStorageImages,
                      "In PSO '", m_Desc.Name, "', the number of storage images (", NumStorageImages, ") exceeds the limit (", Limits.maxDescriptorSetStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxDescriptorSetStorageBuffers,
                      "In PSO '", m_Desc.Name, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffers, ").");
        DEV_CHECK_ERR(NumDynamicStorageBuffers <= Limits.maxDescriptorSetStorageBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic storage buffers (", NumDynamicStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxDescriptorSetUniformBuffers,
                      "In PSO '", m_Desc.Name, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffers, ").");
        DEV_CHECK_ERR(NumDynamicUniformBuffers <= Limits.maxDescriptorSetUniformBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic uniform buffers (", NumDynamicUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxDescriptorSetInputAttachments,
                      "In PSO '", m_Desc.Name, "', the number of input attachments (", NumInputAttachments, ") exceeds the limit (", Limits.maxDescriptorSetInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxDescriptorSetAccelerationStructures,
                      "In PSO '", m_Desc.Name, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the limit (", ASLimits.maxDescriptorSetAccelerationStructures, ").");
    }

    // Check per stage descriptor count
    for (Uint32 ShaderInd = 0; ShaderInd < PerStageDescriptorCount.size(); ++ShaderInd)
    {
        if (!ShaderStagePresented[ShaderInd])
            continue;

        const std::array<Uint32, DescCount>& NumDesc    = PerStageDescriptorCount[ShaderInd];
        const SHADER_TYPE                    ShaderType = GetShaderTypeFromPipelineIndex(ShaderInd, m_Desc.PipelineType);
        const char*                          StageName  = GetShaderTypeLiteralName(ShaderType);

        const Uint32 NumSampledImages =
            NumDesc[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            NumDesc[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumUniformBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumSamplers               = NumDesc[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumInputAttachments       = NumDesc[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = NumDesc[static_cast<Uint32>(DescriptorType::AccelerationStructure)];
        const Uint32 NumResources              = NumSampledImages + NumStorageImages + NumStorageBuffers + NumUniformBuffers + NumSamplers + NumInputAttachments + NumAccelerationStructures;

        DEV_CHECK_ERR(NumResources <= Limits.maxPerStageResources,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the total number of resources (", NumResources, ") exceeds the per-stage limit (", Limits.maxPerStageResources, ").");
        DEV_CHECK_ERR(NumSamplers <= Limits.maxPerStageDescriptorSamplers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of samplers (", NumSamplers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxPerStageDescriptorSampledImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of sampled images (", NumSampledImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxPerStageDescriptorStorageImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage images (", NumStorageImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxPerStageDescriptorStorageBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageBuffers, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxPerStageDescriptorUniformBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorUniformBuffers, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxPerStageDescriptorInputAttachments,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of input attachments (", NumInputAttachments, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxPerStageDescriptorAccelerationStructures,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the per-stage limit (", ASLimits.maxPerStageDescriptorAccelerationStructures, ").");
    }
}